

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsa.c
# Opt level: O0

int alsa_update_nonstream_voice(ALLEGRO_VOICE *voice,void **buf,int *bytes)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  int iVar4;
  int blen;
  int bpos;
  ALSA_VOICE *alsa_voice;
  int *bytes_local;
  void **buf_local;
  ALLEGRO_VOICE *voice_local;
  
  puVar3 = (uint *)voice->extra;
  iVar4 = voice->attached_stream->pos * *puVar3;
  uVar1 = puVar3[1];
  uVar2 = *puVar3;
  *buf = (void *)((long)(voice->attached_stream->spl_data).buffer.f32 + (long)iVar4);
  if ((puVar3[4] & 1) == 0) {
    if ((int)(uVar1 * uVar2) < iVar4 + *bytes) {
      *bytes = uVar1 * uVar2 - iVar4;
      if (voice->attached_stream->loop == ALLEGRO_PLAYMODE_ONCE) {
        *(undefined1 *)((long)puVar3 + 0x11) = 1;
        voice->attached_stream->pos = 0;
      }
      if (voice->attached_stream->loop == ALLEGRO_PLAYMODE_LOOP) {
        voice->attached_stream->pos = 0;
      }
      else if (voice->attached_stream->loop == ALLEGRO_PLAYMODE_BIDIR) {
        *(undefined1 *)(puVar3 + 4) = 1;
        voice->attached_stream->pos = puVar3[1];
      }
      return 1;
    }
    voice->attached_stream->pos = (uint)*bytes / *puVar3 + voice->attached_stream->pos;
  }
  else {
    if (iVar4 - *bytes < 0) {
      *bytes = iVar4;
      voice->attached_stream->pos = 0;
      *(undefined1 *)(puVar3 + 4) = 0;
      return 1;
    }
    voice->attached_stream->pos = voice->attached_stream->pos - (uint)*bytes / *puVar3;
  }
  return 0;
}

Assistant:

static int alsa_update_nonstream_voice(ALLEGRO_VOICE *voice, void **buf, int *bytes)
{
   ALSA_VOICE *alsa_voice = (ALSA_VOICE*)voice->extra;
   int bpos = voice->attached_stream->pos * alsa_voice->frame_size;
   int blen = alsa_voice->len * alsa_voice->frame_size;

   *buf = (char *)voice->attached_stream->spl_data.buffer.ptr + bpos;

   if (!alsa_voice->reversed) {
      if (bpos + *bytes > blen) {
         *bytes = blen - bpos;
         if (voice->attached_stream->loop == ALLEGRO_PLAYMODE_ONCE) {
            alsa_voice->stop = true;
            voice->attached_stream->pos = 0;
         }
         if (voice->attached_stream->loop == ALLEGRO_PLAYMODE_LOOP) {
            voice->attached_stream->pos = 0;
         }
         else if (voice->attached_stream->loop == ALLEGRO_PLAYMODE_BIDIR) {
            alsa_voice->reversed = true;
            voice->attached_stream->pos = alsa_voice->len;
         }
         return 1;
      }
      else
         voice->attached_stream->pos += *bytes / alsa_voice->frame_size;
   }
   else {
      if (bpos - *bytes < 0) {
         *bytes = bpos;
         /* loop will be ALLEGRO_PLAYMODE_BIDIR, other playing modes that play
            backwards are not currently supported by the API */
         /*if (voice->attached_stream->loop != ALLEGRO_PLAYMODE_BIDIR)
            alsa_voice->stop = true;*/

         voice->attached_stream->pos = 0;
         alsa_voice->reversed = false;
         return 1;
      }
      else
         voice->attached_stream->pos -= *bytes / alsa_voice->frame_size;
   }

   return 0;
}